

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

uint32_t elf_findsymidx(SymTabList *sl,char *name,uint16_t shndx)

{
  SymbolNode **ppSVar1;
  int iVar2;
  unsigned_long uVar3;
  SymbolNode *pSVar4;
  
  ppSVar1 = sl->hashtab;
  uVar3 = elf_hash(name);
  pSVar4 = ppSVar1[uVar3 % sl->htabsize];
  while( true ) {
    if (pSVar4 == (SymbolNode *)0x0) {
      return 0;
    }
    iVar2 = strcmp(name,pSVar4->name);
    if ((iVar2 == 0) && (pSVar4->shndx == shndx)) break;
    pSVar4 = pSVar4->hashchain;
  }
  return pSVar4->index;
}

Assistant:

static uint32_t elf_findsymidx(struct SymTabList *sl,const char *name,
                               uint16_t shndx)
/* find an ELF symbol by its name and shndx */
/* return its symbol table index, index=0 means 'not found' */
{
  struct SymbolNode **chain = &sl->hashtab[elf_hash(name) % sl->htabsize];
  struct SymbolNode *sym;

  while (sym = *chain) {
    if (!strcmp(name,sym->name) && sym->shndx==shndx)
      return sym->index;
    chain = &sym->hashchain;
  }
  return 0;
}